

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListAppendWaitOnEvents
          (ze_command_list_handle_t hCommandList,uint32_t numEvents,ze_event_handle_t *phEvents)

{
  ze_pfnCommandListAppendWaitOnEvents_t pfnAppendWaitOnEvents;
  ze_result_t result;
  ze_event_handle_t *phEvents_local;
  uint32_t numEvents_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnAppendWaitOnEvents._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c3e0 != (code *)0x0) {
    pfnAppendWaitOnEvents._4_4_ = (*DAT_0011c3e0)(hCommandList,numEvents,phEvents);
  }
  return pfnAppendWaitOnEvents._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListAppendWaitOnEvents(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t numEvents,                             ///< [in] number of events to wait on before continuing
        ze_event_handle_t* phEvents                     ///< [in][range(0, numEvents)] handles of the events to wait on before
                                                        ///< continuing
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAppendWaitOnEvents = context.zeDdiTable.CommandList.pfnAppendWaitOnEvents;
        if( nullptr != pfnAppendWaitOnEvents )
        {
            result = pfnAppendWaitOnEvents( hCommandList, numEvents, phEvents );
        }
        else
        {
            // generic implementation
        }

        return result;
    }